

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptRegExp::GetSpecialPropertyName
          (JavascriptRegExp *this,uint32 index,JavascriptString **propertyName,
          ScriptContext *requestContext)

{
  uint uVar1;
  PropertyId *pPVar2;
  PropertyString *pPVar3;
  
  uVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x40])();
  if (index < uVar1) {
    pPVar2 = GetSpecialPropertyIdsInlined(this);
    pPVar3 = ScriptContext::GetPropertyString(requestContext,pPVar2[index]);
    *propertyName = &pPVar3->super_JavascriptString;
  }
  return (uint)(index < uVar1);
}

Assistant:

BOOL JavascriptRegExp::GetSpecialPropertyName(uint32 index, JavascriptString ** propertyName, ScriptContext * requestContext)
    {
        uint length = GetSpecialPropertyCount();

        if (index < length)
        {
            *propertyName = requestContext->GetPropertyString(GetSpecialPropertyIdsInlined()[index]);
            return true;
        }
        return false;
    }